

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O0

void x11_get_auth_from_authfile(X11Display *disp,char *authfilename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  bool bVar7;
  void *__src;
  size_t factor1;
  _Bool _Var8;
  uint uVar9;
  int iVar10;
  FILE *__stream;
  char *str;
  void *__ptr;
  size_t sVar11;
  char *__nptr;
  uchar *puVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  ptrlen pVar29;
  ptrlen pVar30;
  ptrlen pVar31;
  int local_164;
  _Bool local_149;
  char cStack_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char buf_2 [16];
  int local_12c;
  undefined1 auStack_128 [4];
  char buf_1 [4];
  size_t local_120;
  int *local_f8;
  size_t local_f0;
  _Bool match;
  _Bool localhost;
  size_t BUF_SIZE;
  size_t MAX_RECORD_SIZE;
  char *ourhostname;
  _Bool ideal_match;
  int displaynum;
  char *displaynum_string;
  ptrlen data;
  ptrlen protoname;
  ptrlen addr;
  int protocol;
  int family;
  BinarySource src [1];
  int size;
  char *buf;
  FILE *authfp;
  char *authfilename_local;
  X11Display *disp_local;
  
  ourhostname._3_1_ = 0;
  local_149 = false;
  if ((disp->unixdomain & 1U) == 0) {
    local_149 = sk_address_is_local(disp->addr);
  }
  __stream = fopen(authfilename,"rb");
  if (__stream != (FILE *)0x0) {
    str = get_hostname();
    __ptr = safemalloc(0x8000c,1,0);
    sVar11 = fread(__ptr,1,0x8000c,__stream);
    src[0].binarysource_._4_4_ = (int)sVar11;
    pVar29 = make_ptrlen(__ptr,(long)src[0].binarysource_._4_4_);
    BinarySource_INIT__((BinarySource *)&protocol,pVar29);
    while (((ourhostname._3_1_ ^ 0xff) & 1) != 0) {
      bVar7 = false;
      if ((void *)0x40005 < src[0].data) {
        src[0].binarysource_._4_4_ = src[0].binarysource_._4_4_ - (int)src[0].data;
        memcpy(__ptr,(void *)((long)__ptr + (long)src[0].data),(long)src[0].binarysource_._4_4_);
        sVar11 = fread((void *)((long)__ptr + (long)src[0].binarysource_._4_4_),1,
                       0x8000c - (long)src[0].binarysource_._4_4_,__stream);
        src[0].binarysource_._4_4_ = src[0].binarysource_._4_4_ + (int)sVar11;
        pVar29 = make_ptrlen(__ptr,(long)src[0].binarysource_._4_4_);
        BinarySource_INIT__((BinarySource *)&protocol,pVar29);
      }
      uVar9 = BinarySource_get_uint16((BinarySource *)src[0]._24_8_);
      pVar29 = BinarySource_get_string_xauth((BinarySource *)src[0]._24_8_);
      local_f8 = (int *)pVar29.ptr;
      local_f0 = pVar29.len;
      pVar30 = BinarySource_get_string_xauth((BinarySource *)src[0]._24_8_);
      __nptr = mkstr(pVar30);
      if (*__nptr == '\0') {
        local_164 = -1;
      }
      else {
        local_164 = atoi(__nptr);
      }
      safefree(__nptr);
      pVar30 = BinarySource_get_string_xauth((BinarySource *)src[0]._24_8_);
      pVar31 = BinarySource_get_string_xauth((BinarySource *)src[0]._24_8_);
      _auStack_128 = pVar31.ptr;
      __src = _auStack_128;
      local_120 = pVar31.len;
      factor1 = local_120;
      _auStack_128 = pVar31;
      if (*(int *)(src[0]._24_8_ + 0x18) != 0) break;
      if ((-1 < disp->displaynum) && ((local_164 < 0 || (disp->displaynum == local_164)))) {
        addr.len._0_4_ = 1;
        while (((uint)addr.len < 3 &&
               (_Var8 = ptrlen_eq_string(pVar30,x11_authnames[(int)(uint)addr.len]), !_Var8))) {
          addr.len._0_4_ = (uint)addr.len + 1;
        }
        if ((uint)addr.len != 3) {
          if (uVar9 == 0) {
            if (((((disp->unixdomain & 1U) == 0) && (iVar10 = sk_addrtype(disp->addr), iVar10 == 1))
                && (sk_addrcopy(disp->addr,(char *)&local_12c), local_f0 == 4)) &&
               (*local_f8 == local_12c)) {
              bVar7 = true;
              ourhostname._3_1_ = (local_149 ^ 0xffU) & 1;
            }
          }
          else if (uVar9 == 6) {
            if ((((disp->unixdomain & 1U) == 0) && (iVar10 = sk_addrtype(disp->addr), iVar10 == 2))
               && (sk_addrcopy(disp->addr,&cStack_148), local_f0 == 0x10)) {
              cVar13 = -((char)*local_f8 == cStack_148);
              cVar14 = -(*(char *)((long)local_f8 + 1) == cStack_147);
              cVar15 = -(*(char *)((long)local_f8 + 2) == cStack_146);
              cVar16 = -(*(char *)((long)local_f8 + 3) == cStack_145);
              cVar17 = -((char)local_f8[1] == cStack_144);
              cVar18 = -(*(char *)((long)local_f8 + 5) == cStack_143);
              cVar19 = -(*(char *)((long)local_f8 + 6) == cStack_142);
              cVar20 = -(*(char *)((long)local_f8 + 7) == cStack_141);
              cVar21 = -((char)local_f8[2] == buf_2[0]);
              cVar22 = -(*(char *)((long)local_f8 + 9) == buf_2[1]);
              cVar23 = -(*(char *)((long)local_f8 + 10) == buf_2[2]);
              cVar24 = -(*(char *)((long)local_f8 + 0xb) == buf_2[3]);
              cVar25 = -((char)local_f8[3] == buf_2[4]);
              cVar26 = -(*(char *)((long)local_f8 + 0xd) == buf_2[5]);
              cVar27 = -(*(char *)((long)local_f8 + 0xe) == buf_2[6]);
              bVar28 = -(*(char *)((long)local_f8 + 0xf) == buf_2[7]);
              auVar1[1] = cVar14;
              auVar1[0] = cVar13;
              auVar1[2] = cVar15;
              auVar1[3] = cVar16;
              auVar1[4] = cVar17;
              auVar1[5] = cVar18;
              auVar1[6] = cVar19;
              auVar1[7] = cVar20;
              auVar1[8] = cVar21;
              auVar1[9] = cVar22;
              auVar1[10] = cVar23;
              auVar1[0xb] = cVar24;
              auVar1[0xc] = cVar25;
              auVar1[0xd] = cVar26;
              auVar1[0xe] = cVar27;
              auVar1[0xf] = bVar28;
              auVar2[1] = cVar14;
              auVar2[0] = cVar13;
              auVar2[2] = cVar15;
              auVar2[3] = cVar16;
              auVar2[4] = cVar17;
              auVar2[5] = cVar18;
              auVar2[6] = cVar19;
              auVar2[7] = cVar20;
              auVar2[8] = cVar21;
              auVar2[9] = cVar22;
              auVar2[10] = cVar23;
              auVar2[0xb] = cVar24;
              auVar2[0xc] = cVar25;
              auVar2[0xd] = cVar26;
              auVar2[0xe] = cVar27;
              auVar2[0xf] = bVar28;
              auVar6[1] = cVar16;
              auVar6[0] = cVar15;
              auVar6[2] = cVar17;
              auVar6[3] = cVar18;
              auVar6[4] = cVar19;
              auVar6[5] = cVar20;
              auVar6[6] = cVar21;
              auVar6[7] = cVar22;
              auVar6[8] = cVar23;
              auVar6[9] = cVar24;
              auVar6[10] = cVar25;
              auVar6[0xb] = cVar26;
              auVar6[0xc] = cVar27;
              auVar6[0xd] = bVar28;
              auVar5[1] = cVar17;
              auVar5[0] = cVar16;
              auVar5[2] = cVar18;
              auVar5[3] = cVar19;
              auVar5[4] = cVar20;
              auVar5[5] = cVar21;
              auVar5[6] = cVar22;
              auVar5[7] = cVar23;
              auVar5[8] = cVar24;
              auVar5[9] = cVar25;
              auVar5[10] = cVar26;
              auVar5[0xb] = cVar27;
              auVar5[0xc] = bVar28;
              auVar4[1] = cVar18;
              auVar4[0] = cVar17;
              auVar4[2] = cVar19;
              auVar4[3] = cVar20;
              auVar4[4] = cVar21;
              auVar4[5] = cVar22;
              auVar4[6] = cVar23;
              auVar4[7] = cVar24;
              auVar4[8] = cVar25;
              auVar4[9] = cVar26;
              auVar4[10] = cVar27;
              auVar4[0xb] = bVar28;
              auVar3[1] = cVar19;
              auVar3[0] = cVar18;
              auVar3[2] = cVar20;
              auVar3[3] = cVar21;
              auVar3[4] = cVar22;
              auVar3[5] = cVar23;
              auVar3[6] = cVar24;
              auVar3[7] = cVar25;
              auVar3[8] = cVar26;
              auVar3[9] = cVar27;
              auVar3[10] = bVar28;
              if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                           (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                           (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                           (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                           (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(
                                                  cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(
                                                  cVar22,CONCAT12(cVar21,CONCAT11(cVar20,cVar19)))))
                                                  )))) >> 7) & 1) << 6 |
                           (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(
                                                  cVar25,CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(
                                                  cVar22,CONCAT11(cVar21,cVar20)))))))) >> 7) & 1)
                           << 7 | (ushort)(bVar28 >> 7) << 0xf) == 0xffff) {
                bVar7 = true;
                ourhostname._3_1_ = (local_149 ^ 0xffU) & 1;
              }
            }
          }
          else if ((((uVar9 == 0x100) && (((disp->unixdomain & 1U) != 0 || (local_149 != false))))
                   && (str != (char *)0x0)) && (_Var8 = ptrlen_eq_string(pVar29,str), _Var8)) {
            bVar7 = true;
            ourhostname._3_1_ = 1;
          }
          if (bVar7) {
            disp->localauthproto = (uint)addr.len;
            safefree(disp->localauthdata);
            puVar12 = (uchar *)safemalloc(factor1,1,0);
            disp->localauthdata = puVar12;
            memcpy(disp->localauthdata,__src,factor1);
            disp->localauthdatalen = (int)pVar31.len;
          }
        }
      }
    }
    fclose(__stream);
    smemclr(__ptr,0x8000c);
    safefree(__ptr);
    safefree(str);
  }
  return;
}

Assistant:

void x11_get_auth_from_authfile(struct X11Display *disp,
                                const char *authfilename)
{
    FILE *authfp;
    char *buf;
    int size;
    BinarySource src[1];
    int family, protocol;
    ptrlen addr, protoname, data;
    char *displaynum_string;
    int displaynum;
    bool ideal_match = false;
    char *ourhostname;

    /* A maximally sized (wildly implausible) .Xauthority record
     * consists of a 16-bit integer to start with, then four strings,
     * each of which has a 16-bit length field followed by that many
     * bytes of data (i.e. up to 0xFFFF bytes). */
    const size_t MAX_RECORD_SIZE = 2 + 4 * (2+0xFFFF);

    /* We'll want a buffer of twice that size (see below). */
    const size_t BUF_SIZE = 2 * MAX_RECORD_SIZE;

    /*
     * Normally we should look for precisely the details specified in
     * `disp'. However, there's an oddity when the display is local:
     * displays like "localhost:0" usually have their details stored
     * in a Unix-domain-socket record (even if there isn't actually a
     * real Unix-domain socket available, as with OpenSSH's proxy X11
     * server).
     *
     * This is apparently a fudge to get round the meaninglessness of
     * "localhost" in a shared-home-directory context -- xauth entries
     * for Unix-domain sockets already disambiguate this by storing
     * the *local* hostname in the conveniently-blank hostname field,
     * but IP "localhost" records couldn't do this. So, typically, an
     * IP "localhost" entry in the auth database isn't present and if
     * it were it would be ignored.
     *
     * However, we don't entirely trust that (say) Windows X servers
     * won't rely on a straight "localhost" entry, bad idea though
     * that is; so if we can't find a Unix-domain-socket entry we'll
     * fall back to an IP-based entry if we can find one.
     */
    bool localhost = !disp->unixdomain && sk_address_is_local(disp->addr);

    authfp = fopen(authfilename, "rb");
    if (!authfp)
        return;

    ourhostname = get_hostname();

    /*
     * Allocate enough space to hold two maximally sized records, so
     * that a full record can start anywhere in the first half. That
     * way we avoid the accidentally-quadratic algorithm that would
     * arise if we moved everything to the front of the buffer after
     * consuming each record; instead, we only move everything to the
     * front after our current position gets past the half-way mark.
     * Before then, there's no need to move anyway; so this guarantees
     * linear time, in that every byte written into this buffer moves
     * at most once (because every move is from the second half of the
     * buffer to the first half).
     */
    buf = snewn(BUF_SIZE, char);
    size = fread(buf, 1, BUF_SIZE, authfp);
    BinarySource_BARE_INIT(src, buf, size);

    while (!ideal_match) {
        bool match = false;

        if (src->pos >= MAX_RECORD_SIZE) {
            size -= src->pos;
            memcpy(buf, buf + src->pos, size);
            size += fread(buf + size, 1, BUF_SIZE - size, authfp);
            BinarySource_BARE_INIT(src, buf, size);
        }

        family = get_uint16(src);
        addr = get_string_xauth(src);
        displaynum_string = mkstr(get_string_xauth(src));
        displaynum = displaynum_string[0] ? atoi(displaynum_string) : -1;
        sfree(displaynum_string);
        protoname = get_string_xauth(src);
        data = get_string_xauth(src);
        if (get_err(src))
            break;

        /*
         * Now we have a full X authority record in memory. See
         * whether it matches the display we're trying to
         * authenticate to.
         *
         * The details we've just read should be interpreted as
         * follows:
         *
         *  - 'family' is the network address family used to
         *    connect to the display. 0 means IPv4; 6 means IPv6;
         *    256 means Unix-domain sockets.
         *
         *  - 'addr' is the network address itself. For IPv4 and
         *    IPv6, this is a string of binary data of the
         *    appropriate length (respectively 4 and 16 bytes)
         *    representing the address in big-endian format, e.g.
         *    7F 00 00 01 means IPv4 localhost. For Unix-domain
         *    sockets, this is the host name of the machine on
         *    which the Unix-domain display resides (so that an
         *    .Xauthority file on a shared file system can contain
         *    authority entries for Unix-domain displays on
         *    several machines without them clashing).
         *
         *  - 'displaynum' is the display number. An empty display
         *    number is a wildcard for any display number.
         *
         *  - 'protoname' is the authorisation protocol, encoded as
         *    its canonical string name (i.e. "MIT-MAGIC-COOKIE-1",
         *    "XDM-AUTHORIZATION-1" or something we don't recognise).
         *
         *  - 'data' is the actual authorisation data, stored in
         *    binary form.
         */

        if (disp->displaynum < 0 ||
            (displaynum >= 0 && disp->displaynum != displaynum))
            continue;                  /* not the one */

        for (protocol = 1; protocol < lenof(x11_authnames); protocol++)
            if (ptrlen_eq_string(protoname, x11_authnames[protocol]))
                break;
        if (protocol == lenof(x11_authnames))
            continue;  /* don't recognise this protocol, look for another */

        switch (family) {
          case 0:   /* IPv4 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV4) {
                char buf[4];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 4 && !memcmp(addr.ptr, buf, 4)) {
                    match = true;
                    /* If this is a "localhost" entry, note it down
                     * but carry on looking for a Unix-domain entry. */
                    ideal_match = !localhost;
                }
            }
            break;
          case 6:   /* IPv6 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV6) {
                char buf[16];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 16 && !memcmp(addr.ptr, buf, 16)) {
                    match = true;
                    ideal_match = !localhost;
                }
            }
            break;
          case 256: /* Unix-domain / localhost */
            if ((disp->unixdomain || localhost)
                && ourhostname && ptrlen_eq_string(addr, ourhostname)) {
                /* A matching Unix-domain socket is always the best
                 * match. */
                match = true;
                ideal_match = true;
            }
            break;
        }

        if (match) {
            /* Current best guess -- may be overridden if !ideal_match */
            disp->localauthproto = protocol;
            sfree(disp->localauthdata); /* free previous guess, if any */
            disp->localauthdata = snewn(data.len, unsigned char);
            memcpy(disp->localauthdata, data.ptr, data.len);
            disp->localauthdatalen = data.len;
        }
    }

    fclose(authfp);
    smemclr(buf, 2 * MAX_RECORD_SIZE);
    sfree(buf);
    sfree(ourhostname);
}